

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::RunContext::getCurrentTestName_abi_cxx11_(string *__return_storage_ptr__,RunContext *this)

{
  TestCaseInfo *pTVar1;
  allocator<char> local_19;
  RunContext *local_18;
  RunContext *this_local;
  
  local_18 = this;
  this_local = (RunContext *)__return_storage_ptr__;
  if (this->m_activeTestCase == (TestCase *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    pTVar1 = TestCase::getTestCaseInfo(this->m_activeTestCase);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getCurrentTestName() const {
            return m_activeTestCase
                ? m_activeTestCase->getTestCaseInfo().name
                : "";
        }